

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmakemain.cxx
# Opt level: O1

void anon_unknown.dwarf_f484::cmakemainMessageCallback(string *m,cmMessageMetadata *md,cmake *cm)

{
  ostream *poVar1;
  cmake *cm_00;
  char local_31;
  string local_30;
  
  cmsysTerminal_cfprintf(md->desiredColor,(FILE *)_stderr,"%s",(m->_M_dataplus)._M_p);
  fflush(_stderr);
  (anonymous_namespace)::cmakemainGetStack_abi_cxx11_(&local_30,(_anonymous_namespace_ *)cm,cm_00);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,local_30._M_dataplus._M_p,local_30._M_string_length);
  local_31 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_31,1);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmakemainMessageCallback(const std::string& m,
                              const cmMessageMetadata& md, cmake* cm)
{
#if defined(_WIN32)
  // FIXME: On Windows we replace cerr's streambuf with a custom
  // implementation that converts our internal UTF-8 encoding to the
  // console's encoding.  It also does *not* replace LF with CRLF.
  // Since stderr does not convert encoding and does convert LF, we
  // cannot use it to print messages.  Another implementation will
  // be needed to print colored messages on Windows.
  static_cast<void>(md);
  std::cerr << m << cmakemainGetStack(cm) << '\n' << std::flush;
#else
  cmsysTerminal_cfprintf(md.desiredColor, stderr, "%s", m.c_str());
  fflush(stderr); // stderr is buffered in some cases.
  std::cerr << cmakemainGetStack(cm) << '\n' << std::flush;
#endif
}